

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateFile(xmlSchemaValidCtxtPtr ctxt,char *filename,int options)

{
  int iVar1;
  xmlParserCtxtPtr pctxt;
  
  if ((filename != (char *)0x0 && ctxt != (xmlSchemaValidCtxtPtr)0x0) &&
     (pctxt = xmlCreateURLParserCtxt(filename,0), pctxt != (xmlParserCtxtPtr)0x0)) {
    (*xmlFree)(pctxt->sax);
    pctxt->sax = (_xmlSAXHandler *)0x0;
    iVar1 = xmlSchemaValidateStreamInternal(ctxt,pctxt);
    xmlFreeParserCtxt(pctxt);
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlSchemaValidateFile(xmlSchemaValidCtxtPtr ctxt,
                      const char * filename,
		      int options ATTRIBUTE_UNUSED)
{
    int ret;
    xmlParserCtxtPtr pctxt = NULL;

    if ((ctxt == NULL) || (filename == NULL))
        return (-1);

    pctxt = xmlCreateURLParserCtxt(filename, 0);
    if (pctxt == NULL)
	return (-1);
    /* We really want pctxt->sax to be NULL here. */
    xmlFree(pctxt->sax);
    pctxt->sax = NULL;
    ret = xmlSchemaValidateStreamInternal(ctxt, pctxt);
    xmlFreeParserCtxt(pctxt);
    return (ret);
}